

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code llvm::sys::fs::is_regular_file(Twine *path,bool *result)

{
  int StatRet;
  error_category *peVar1;
  StringRef SVar2;
  error_code eVar3;
  file_status st;
  SmallString<128U> PathStorage;
  stat Status;
  file_status local_198;
  SmallVectorImpl<char> local_150;
  undefined1 local_140 [128];
  stat local_c0;
  
  local_198.super_basic_file_status.fs_st_size._0_4_ = 0;
  local_198.super_basic_file_status._36_8_ = 0;
  local_198.super_basic_file_status.fs_st_atime_nsec = 0;
  local_198.super_basic_file_status.fs_st_mtime_nsec = 0;
  local_198.super_basic_file_status.fs_st_uid = 0;
  local_198.super_basic_file_status.fs_st_gid = 0;
  local_198.super_basic_file_status.fs_st_atime = 0;
  local_198.super_basic_file_status.fs_st_mtime = 0;
  local_198.super_basic_file_status.Perms = perms_not_known;
  local_198.fs_st_dev = 0;
  local_198.fs_st_nlinks = 0;
  local_198.fs_st_ino = 0;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_140;
  SVar2 = Twine::toNullTerminatedStringRef(path,&local_150);
  StatRet = stat(SVar2.Data,(stat *)&local_c0);
  eVar3 = fillStatus(StatRet,&local_c0,&local_198);
  peVar1 = eVar3._M_cat;
  if ((undefined1 *)
      local_150.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_140) {
    free(local_150.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if (eVar3._M_value == 0) {
    *result = local_198.super_basic_file_status.Type == regular_file;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  eVar3._4_4_ = 0;
  eVar3._M_cat = peVar1;
  return eVar3;
}

Assistant:

std::error_code is_regular_file(const Twine &path, bool &result) {
  file_status st;
  if (std::error_code ec = status(path, st))
    return ec;
  result = is_regular_file(st);
  return std::error_code();
}